

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5db41::
HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::HilbertSort3d
          (HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>
           *this,VertexMesh *M,iterator b,iterator e,index_t limit)

{
  function<void_()> f7;
  function<void_()> f8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  _Var1;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this->M_ = M;
  (this->m8_)._M_current = (uint *)0x0;
  (this->m0_)._M_current = (uint *)0x0;
  (this->m1_)._M_current = (uint *)0x0;
  (this->m2_)._M_current = (uint *)0x0;
  (this->m3_)._M_current = (uint *)0x0;
  (this->m4_)._M_current = (uint *)0x0;
  (this->m5_)._M_current = (uint *)0x0;
  (this->m6_)._M_current = (uint *)0x0;
  (this->m7_)._M_current = (uint *)0x0;
  if (((long)e._M_current - (long)b._M_current & 0x3fffffff8U) != 0) {
    if (((long)e._M_current - (long)b._M_current & 0x3fffff000U) == 0) {
      (anonymous_namespace)::
      HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::
      sort<0,false,false,false,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>>
                (M,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                    )b._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                  )e._M_current,(index_t)e._M_current);
      return;
    }
    (this->m0_)._M_current = b._M_current;
    (this->m8_)._M_current = e._M_current;
    _Var1 = (anonymous_namespace)::
            reorder_split<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,(anonymous_namespace)::Hilbert_vcmp<0,false,(anonymous_namespace)::VertexMesh>>
                      (b._M_current,e._M_current,
                       (Hilbert_vcmp<0,_false,_(anonymous_namespace)::VertexMesh>)M);
    (this->m4_)._M_current = _Var1._M_current;
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8991:3)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8991:3)>
               ::_M_manager;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8992:3)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8992:3)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    local_38._M_unused._M_object = this;
    GEO::parallel((function<void_()> *)&local_38,(function<void_()> *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8996:3)>
               ::_M_invoke;
    local_98._8_8_ = 0;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8996:3)>
               ::_M_manager;
    local_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8997:3)>
               ::_M_invoke;
    local_f8._8_8_ = 0;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8997:3)>
               ::_M_manager;
    local_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8998:3)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8998:3)>
               ::_M_manager;
    local_118._8_8_ = 0;
    local_100 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8999:3)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:8999:3)>
                ::_M_manager;
    local_118._M_unused._M_object = this;
    local_f8._M_unused._M_object = this;
    local_98._M_unused._M_object = this;
    local_78._M_unused._M_object = this;
    GEO::parallel((function<void_()> *)&local_78,(function<void_()> *)&local_98,
                  (function<void_()> *)&local_f8,(function<void_()> *)&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    local_b8._8_8_ = 0;
    local_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9003:3)>
               ::_M_invoke;
    local_d8._8_8_ = 0;
    local_a8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9003:3)>
               ::_M_manager;
    local_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9004:3)>
               ::_M_invoke;
    local_138._8_8_ = 0;
    local_c8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9004:3)>
               ::_M_manager;
    local_120 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9005:3)>
                ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9005:3)>
                ::_M_manager;
    local_158._8_8_ = 0;
    local_140 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9006:3)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9006:3)>
                ::_M_manager;
    local_178._8_8_ = 0;
    local_160 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9007:3)>
                ::_M_invoke;
    local_198._8_8_ = 0;
    local_168 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9007:3)>
                ::_M_manager;
    local_180 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9008:3)>
                ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9008:3)>
                ::_M_manager;
    f7.super__Function_base._M_functor._8_8_ = &stack0xfffffffffffffe28;
    f7.super__Function_base._M_functor._M_unused._M_object = &stack0xfffffffffffffe48;
    f7.super__Function_base._M_manager = (_Manager_type)this;
    f7._M_invoker = (_Invoker_type)0x0;
    f8.super__Function_base._M_functor._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9010:3)>
         ::_M_invoke;
    f8.super__Function_base._M_functor._M_unused._M_function_pointer =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp:9010:3)>
         ::_M_manager;
    f8.super__Function_base._M_manager = (_Manager_type)this;
    f8._M_invoker = (_Invoker_type)0x0;
    local_198._M_unused._M_object = this;
    local_178._M_unused._M_object = this;
    local_158._M_unused._M_object = this;
    local_138._M_unused._M_object = this;
    local_d8._M_unused._M_object = this;
    local_b8._M_unused._M_object = this;
    GEO::parallel((function<void_()> *)&local_b8,(function<void_()> *)&local_d8,
                  (function<void_()> *)&local_138,(function<void_()> *)&local_158,
                  (function<void_()> *)&local_178,(function<void_()> *)&local_198,f7,f8);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe28);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe48);
    std::_Function_base::~_Function_base((_Function_base *)&local_198);
    std::_Function_base::~_Function_base((_Function_base *)&local_178);
    std::_Function_base::~_Function_base((_Function_base *)&local_158);
    std::_Function_base::~_Function_base((_Function_base *)&local_138);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  }
  return;
}

Assistant:

HilbertSort3d(
            const MESH& M,
            vector<index_t>::iterator b,
            vector<index_t>::iterator e,
            index_t limit = 1
        ) :
            M_(M)
        {
            geo_debug_assert(e >= b);
	    geo_cite_with_info(
		"WEB:SpatialSorting",
		"The implementation of spatial sort in GEOGRAM is inspired by "
		"the idea of using \\verb|std::nth_element()| and the recursive"
                " template in the spatial sort package of CGAL"
	    );

            // If the sequence is smaller than the limit, skip it
            if(index_t(e - b) <= limit) {
                return;
            }

            // If the sequence is smaller than 1024, use sequential sorting
            if(index_t(e - b) < 1024) {
                sort<0, false, false, false>(M_, b, e);
                return;
            }

            // Parallel sorting (2 then 4 then 8 sorts in parallel)

// Unfortunately we cannot access consts for template arguments in lambdas in all
// compilers (gcc is OK but not MSVC) so I'm using (ugly) macros here...
	    
#          define COORDX 0
#          define COORDY 1
#          define COORDZ 2
#          define UPX false
#          define UPY false
#          define UPZ false
	    
            m0_ = b;
            m8_ = e;
            m4_ = reorder_split(m0_, m8_, CMP<COORDX, UPX, MESH>(M));

	    
	    parallel(
		[this]() { m2_ = reorder_split(m0_, m4_, CMP<COORDY,  UPY, MESH>(M_)); },
		[this]() { m6_ = reorder_split(m4_, m8_, CMP<COORDY, !UPY, MESH>(M_)); }
	    );

	    parallel(
		[this]() { m1_ = reorder_split(m0_, m2_, CMP<COORDZ,  UPZ, MESH>(M_)); },
		[this]() { m3_ = reorder_split(m2_, m4_, CMP<COORDZ, !UPZ, MESH>(M_)); },
		[this]() { m5_ = reorder_split(m4_, m6_, CMP<COORDZ,  UPZ, MESH>(M_)); },
		[this]() { m7_ = reorder_split(m6_, m8_, CMP<COORDZ, !UPZ, MESH>(M_)); }
	    );

	    parallel(
		[this]() { sort<COORDZ,  UPZ,  UPX,  UPY>(M_, m0_, m1_); },
		[this]() { sort<COORDY,  UPY,  UPZ,  UPX>(M_, m1_, m2_); },
		[this]() { sort<COORDY,  UPY,  UPZ,  UPX>(M_, m2_, m3_); },
		[this]() { sort<COORDX,  UPX, !UPY, !UPZ>(M_, m3_, m4_); },
		[this]() { sort<COORDX,  UPX, !UPY, !UPZ>(M_, m4_, m5_); },
		[this]() { sort<COORDY, !UPY,  UPZ, !UPX>(M_, m5_, m6_); },
		[this]() { sort<COORDY, !UPY,  UPZ, !UPX>(M_, m6_, m7_); },
		[this]() { sort<COORDZ, !UPZ, !UPX,  UPY>(M_, m7_, m8_); }
	    );

#          undef COORDX
#          undef COORDY
#          undef COORDZ
#          undef UPX
#          undef UPY
#          undef UPZ	    
        }